

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O2

void Acb_Ntk4CollectRing(Acb_Ntk_t *pNtk,Vec_Int_t *vStart,Vec_Int_t *vRes,Vec_Int_t *vDists)

{
  int i;
  int iVar1;
  int iVar2;
  Acb_ObjType_t AVar3;
  int iVar4;
  int *piVar5;
  Vec_Int_t *pVVar6;
  long lVar7;
  int i_00;
  int iVar8;
  
  for (i_00 = 0; i_00 < vStart->nSize; i_00 = i_00 + 1) {
    i = Vec_IntEntry(vStart,i_00);
    iVar1 = Vec_IntEntry(vDists,i);
    piVar5 = Acb_ObjFanins(pNtk,i);
    for (lVar7 = 0; lVar7 < *piVar5; lVar7 = lVar7 + 1) {
      iVar8 = piVar5[lVar7 + 1];
      iVar2 = Acb_ObjFaninNum(pNtk,i);
      Acb_Ntk4CollectAdd(pNtk,iVar8,vRes,vDists,(uint)(1 < iVar2) + iVar1);
    }
    iVar8 = 0;
    while( true ) {
      pVVar6 = Vec_WecEntry(&pNtk->vFanouts,i);
      if (pVVar6->nSize <= iVar8) break;
      pVVar6 = Vec_WecEntry(&pNtk->vFanouts,i);
      iVar2 = Vec_IntEntry(pVVar6,iVar8);
      AVar3 = Acb_ObjType(pNtk,iVar2);
      if (AVar3 != ABC_OPER_NONE) {
        iVar4 = Acb_ObjFaninNum(pNtk,i);
        Acb_Ntk4CollectAdd(pNtk,iVar2,vRes,vDists,iVar1 + (uint)(1 < iVar4) * 2);
      }
      iVar8 = iVar8 + 1;
    }
  }
  return;
}

Assistant:

void Acb_Ntk4CollectRing( Acb_Ntk_t * pNtk, Vec_Int_t * vStart, Vec_Int_t * vRes, Vec_Int_t * vDists )
{
    int i, iObj;
    Vec_IntForEachEntry( vStart, iObj, i )
    {
        int k, iFanin, * pFanins, Weight = Vec_IntEntry(vDists, iObj); 
        Acb_ObjForEachFaninFast( pNtk, iObj, pFanins, iFanin, k )
            Acb_Ntk4CollectAdd( pNtk, iFanin, vRes, vDists, Weight + 1*(Acb_ObjFaninNum(pNtk, iObj) > 1) );
        Acb_ObjForEachFanout( pNtk, iObj, iFanin, k )
            Acb_Ntk4CollectAdd( pNtk, iFanin, vRes, vDists, Weight + 2*(Acb_ObjFaninNum(pNtk, iObj) > 1) );
    }
}